

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetNumericVectorConstantWithWords
          (ConstantManager *this,Vector *type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *literal_words)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  Type *type_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type sVar4;
  Instruction *this_00;
  uint32_t local_b4;
  Constant *pCStack_b0;
  uint32_t element_id;
  Constant *element_constant;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_98;
  undefined1 local_90 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> const_data;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  first_word;
  undefined1 local_60 [4];
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> element_ids;
  Integer *int_type;
  Float *float_type;
  uint32_t words_per_element;
  Type *element_type;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *literal_words_local;
  Vector *type_local;
  ConstantManager *this_local;
  
  type_00 = Vector::element_type(type);
  iVar2 = (*type_00->_vptr_Type[0xc])();
  if ((Float *)CONCAT44(extraout_var,iVar2) == (Float *)0x0) {
    iVar2 = (*type_00->_vptr_Type[10])();
    element_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var_00,iVar2);
    if ((Integer *)
        element_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage == (Integer *)0x0) {
      iVar2 = (*type_00->_vptr_Type[8])();
      float_type._4_4_ = (uint)(CONCAT44(extraout_var_01,iVar2) != 0);
    }
    else {
      uVar3 = Integer::width((Integer *)
                             element_ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage);
      float_type._4_4_ = uVar3 >> 5;
    }
  }
  else {
    uVar3 = Float::width((Float *)CONCAT44(extraout_var,iVar2));
    float_type._4_4_ = uVar3 >> 5;
  }
  if ((float_type._4_4_ == 1) || (float_type._4_4_ == 2)) {
    uVar3 = Vector::element_count(type);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(literal_words);
    if (float_type._4_4_ * uVar3 == (int)sVar4) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
      for (first_word._M_current._4_4_ = 0; uVar1 = first_word._M_current._4_4_,
          uVar3 = Vector::element_count(type), uVar1 < uVar3;
          first_word._M_current._4_4_ = first_word._M_current._4_4_ + 1) {
        const_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(literal_words)
        ;
        local_98 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator+((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&const_data.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)(float_type._4_4_ * first_word._M_current._4_4_));
        local_70 = local_98;
        local_a0 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator+(&local_70,(ulong)float_type._4_4_);
        std::allocator<unsigned_int>::allocator
                  ((allocator<unsigned_int> *)((long)&element_constant + 7));
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_90,local_98,local_a0,
                   (allocator_type *)((long)&element_constant + 7));
        std::allocator<unsigned_int>::~allocator
                  ((allocator<unsigned_int> *)((long)&element_constant + 7));
        pCStack_b0 = GetConstant(this,type_00,
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
        this_00 = GetDefiningInstruction(this,pCStack_b0,0,(inst_iterator *)0x0);
        local_b4 = opt::Instruction::result_id(this_00);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,&local_b4);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
      }
      this_local = (ConstantManager *)
                   GetConstant(this,&type->super_Type,
                               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
    }
    else {
      this_local = (ConstantManager *)0x0;
    }
  }
  else {
    this_local = (ConstantManager *)0x0;
  }
  return (Constant *)this_local;
}

Assistant:

const Constant* ConstantManager::GetNumericVectorConstantWithWords(
    const Vector* type, const std::vector<uint32_t>& literal_words) {
  const auto* element_type = type->element_type();
  uint32_t words_per_element = 0;
  if (const auto* float_type = element_type->AsFloat())
    words_per_element = float_type->width() / 32;
  else if (const auto* int_type = element_type->AsInteger())
    words_per_element = int_type->width() / 32;
  else if (element_type->AsBool() != nullptr)
    words_per_element = 1;

  if (words_per_element != 1 && words_per_element != 2) return nullptr;

  if (words_per_element * type->element_count() !=
      static_cast<uint32_t>(literal_words.size())) {
    return nullptr;
  }

  std::vector<uint32_t> element_ids;
  for (uint32_t i = 0; i < type->element_count(); ++i) {
    auto first_word = literal_words.begin() + (words_per_element * i);
    std::vector<uint32_t> const_data(first_word,
                                     first_word + words_per_element);
    const analysis::Constant* element_constant =
        GetConstant(element_type, const_data);
    auto element_id = GetDefiningInstruction(element_constant)->result_id();
    element_ids.push_back(element_id);
  }

  return GetConstant(type, element_ids);
}